

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>::grow
          (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *this,size_t MinSize)

{
  undefined8 *puVar1;
  SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *__ptr;
  undefined8 uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar3 = (ulong)(this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar5 = uVar3 >> 1 | uVar3;
  uVar5 = uVar5 >> 2 | uVar5;
  uVar5 = uVar5 >> 4 | uVar5;
  uVar5 = uVar5 >> 8 | uVar5;
  uVar3 = (uVar3 >> 0x20 | uVar5 >> 0x10 | uVar5) + 1;
  if (uVar3 <= MinSize) {
    uVar3 = MinSize;
  }
  if (0xfffffffe < uVar3) {
    uVar3 = 0xffffffff;
  }
  pvVar4 = malloc(uVar3 << 4);
  if (pvVar4 == (void *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  __ptr = (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *)
          (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
          super_SmallVectorBase.BeginX;
  uVar5 = (ulong)(this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
                 super_SmallVectorBase.Size;
  if (uVar5 != 0) {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)&(__ptr->
                       super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
                       super_SmallVectorBase.BeginX + lVar6);
      uVar2 = puVar1[1];
      *(undefined8 *)((long)pvVar4 + lVar6) = *puVar1;
      ((undefined8 *)((long)pvVar4 + lVar6))[1] = uVar2;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 << 4 != lVar6);
  }
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
  super_SmallVectorBase.BeginX = pvVar4;
  (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
  super_SmallVectorBase.Capacity = (uint)uVar3;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}